

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_process_async_branch(pt_block_decoder *decoder,pt_event *ev)

{
  pt_event *ev_local;
  pt_block_decoder *decoder_local;
  
  if ((decoder == (pt_block_decoder *)0x0) || (ev == (pt_event *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else if (((byte)ev->field_0x4 >> 1 & 1) == 0) {
    if ((*(ushort *)&decoder->field_0xa74 & 1) == 0) {
      decoder_local._4_4_ = -6;
    }
    else {
      decoder->ip = (ev->variant).async_disabled.ip;
      decoder_local._4_4_ = 0;
    }
  }
  else {
    decoder_local._4_4_ = -6;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_blk_process_async_branch(struct pt_block_decoder *decoder,
				       const struct pt_event *ev)
{
	if (!decoder || !ev)
		return -pte_internal;

	/* This event can't be a status update. */
	if (ev->status_update)
		return -pte_bad_context;

	/* We must currently be enabled. */
	if (!decoder->enabled)
		return -pte_bad_context;

	/* Jump to the branch destination.  We will continue from there in the
	 * next iteration.
	 */
	decoder->ip = ev->variant.async_branch.to;

	return 0;
}